

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O0

oonf_layer2_neigh * dlep_extension_get_l2_neighbor(dlep_session *session)

{
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  dlep_session *local_90;
  long local_88;
  undefined1 local_7b [8];
  oonf_layer2_neigh_key key;
  oonf_layer2_net *l2net;
  dlep_session *session_local;
  
  iVar2 = dlep_extension_get_l2_neighbor_key((oonf_layer2_neigh_key *)local_7b,session);
  if (iVar2 == 0) {
    pcVar1 = (session->l2_listener).name;
    uVar3 = oonf_layer2_get_net_tree();
    local_88 = avl_find(uVar3,pcVar1);
    if (local_88 == 0) {
      local_88 = 0;
    }
    else {
      local_88 = local_88 + -0x7a0;
    }
    key.link_id[8] = (undefined1)local_88;
    key.link_id[9] = local_88._1_1_;
    key.link_id[10] = local_88._2_1_;
    key.link_id[0xb] = local_88._3_1_;
    key.link_id[0xc] = local_88._4_1_;
    key.link_id[0xd] = local_88._5_1_;
    key.link_id[0xe] = local_88._6_1_;
    key.link_id[0xf] = local_88._7_1_;
    if (local_88 == 0) {
      session_local = (dlep_session *)0x0;
    }
    else {
      lVar4 = avl_find(local_88 + 0x90,local_7b);
      if (lVar4 == 0) {
        local_90 = (dlep_session *)0x0;
      }
      else {
        local_90 = (dlep_session *)(lVar4 + -0x4c0);
      }
      session_local = local_90;
    }
  }
  else {
    session_local = (dlep_session *)0x0;
  }
  return (oonf_layer2_neigh *)session_local;
}

Assistant:

struct oonf_layer2_neigh *
dlep_extension_get_l2_neighbor(struct dlep_session *session) {
  struct oonf_layer2_net *l2net;

  struct oonf_layer2_neigh_key key;

  if (dlep_extension_get_l2_neighbor_key(&key, session)) {
    return NULL;
  }

  l2net = oonf_layer2_net_get(session->l2_listener.name);
  if (!l2net) {
    return NULL;
  }
  return oonf_layer2_neigh_get_lid(l2net, &key);
}